

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

JavascriptString * __thiscall Js::JavascriptRegExp::ToString(JavascriptRegExp *this,bool sourceOnly)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  CompoundString *this_00;
  undefined4 *puVar4;
  ulong uVar5;
  char16 c;
  undefined7 in_register_00000031;
  char16_t *s;
  ulong uVar6;
  CharCount local_40;
  byte local_3c;
  InternalString str;
  
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&local_40);
  this_00 = CompoundString::NewWithCharCapacity
                      (local_40 + 5,
                       (((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                       javascriptLibrary).ptr);
  if ((int)CONCAT71(in_register_00000031,sourceOnly) == 0) {
    CompoundString::AppendChars(this_00,L'/');
  }
  if ((((this->pattern).ptr)->field_0x18 & 1) == 0) {
    uVar5 = (ulong)local_40;
    if (local_40 == 0) {
      CompoundString::AppendGeneric<5u,Js::CompoundString>
                ((char16 (*) [5])L"(?:)",true,this_00,true);
    }
    else {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar6 = 0;
      bVar3 = false;
      do {
        c = *(char16 *)((ulong)local_3c * 2 + str._0_8_ + uVar6 * 2);
        if ((bVar3) ||
           ((((ushort)c < 0x30 && ((0x800000002400U >> ((ulong)(uint)(ushort)c & 0x3f) & 1) != 0))
            || ((ushort)c - 0x2028 < 2)))) {
          CompoundString::AppendChars(this_00,L'\\');
          if ((ushort)c < 0x2028) {
            if (c == L'\n') {
              c = L'n';
            }
            else if (c == L'\r') {
              c = L'r';
            }
            goto LAB_00d0510d;
          }
          if (c == L'\x2028') {
            s = L"u2028";
          }
          else {
            if (c != L'\x2029') goto LAB_00d0510d;
            s = L"u2029";
          }
          CompoundString::AppendGeneric<6u,Js::CompoundString>((char16 (*) [6])s,true,this_00,true);
LAB_00d0512d:
          bVar3 = false;
        }
        else {
          if (c != L'\\') {
LAB_00d0510d:
            CompoundString::AppendChars(this_00,c);
            goto LAB_00d0512d;
          }
          bVar3 = true;
          if (uVar5 <= uVar6 + 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                        ,0x1d2,"(i + 1 < str.GetLength())","i + 1 < str.GetLength()"
                                       );
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *puVar4 = 0;
          }
        }
        uVar6 = uVar6 + 1;
        uVar5 = (ulong)local_40;
      } while (uVar6 < uVar5);
    }
  }
  else {
    CompoundString::AppendChars
              (this_00,(char16 *)((ulong)((uint)local_3c * 2) + str._0_8_),local_40);
  }
  if (!sourceOnly) {
    CompoundString::AppendChars(this_00,L'/');
    bVar3 = UnifiedRegex::RegexPattern::IsGlobal((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L'g');
    }
    bVar3 = UnifiedRegex::RegexPattern::IsIgnoreCase((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L'i');
    }
    bVar3 = UnifiedRegex::RegexPattern::IsMultiline((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L'm');
    }
    bVar3 = UnifiedRegex::RegexPattern::IsDotAll((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L's');
    }
    bVar3 = UnifiedRegex::RegexPattern::IsUnicode((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L'u');
    }
    bVar3 = UnifiedRegex::RegexPattern::IsSticky((this->pattern).ptr);
    if (bVar3) {
      CompoundString::AppendChars(this_00,L'y');
    }
  }
  return (JavascriptString *)this_00;
}

Assistant:

JavascriptString *JavascriptRegExp::ToString(bool sourceOnly)
    {
        Js::InternalString str = pattern->GetSource();
        CompoundString *const builder = CompoundString::NewWithCharCapacity(str.GetLength() + 5, GetLibrary());

        if (!sourceOnly)
        {
            builder->AppendChars(_u('/'));
        }
        if (pattern->IsLiteral())
        {
            builder->AppendChars(str.GetBuffer(), str.GetLength());
        }
        else
        {
            // Need to ensure that the resulting static regex is functionally equivalent (as written) to 'this' regex. This
            // involves the following:
            //   - Empty regex should result in /(?:)/ rather than //, which is a comment
            //   - Unescaped '/' needs to be escaped so that it doesn't end the static regex prematurely
            //   - Line terminators need to be escaped since they're not allowed in a static regex
            if (str.GetLength() == 0)
            {
                builder->AppendChars(_u("(?:)"));
            }
            else
            {
                bool escape = false;
                for (charcount_t i = 0; i < str.GetLength(); ++i)
                {
                    const char16 c = str.GetBuffer()[i];

                    if(!escape)
                    {
                        switch(c)
                        {
                            case _u('/'):
                            case _u('\n'):
                            case _u('\r'):
                            case _u('\x2028'):
                            case _u('\x2029'):
                                // Unescaped '/' or line terminator needs to be escaped
                                break;

                            case _u('\\'):
                                // Escape sequence; the next character is escaped and shouldn't be escaped further
                                escape = true;
                                Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                                // '\' is appended on the next iteration as 'escape' is true. This handles the case where we
                                // have an escaped line terminator (\<lineTerminator>), where \\n has a different meaning and we
                                // need to use \n instead.
                                continue;

                            default:
                                builder->AppendChars(c);
                                continue;
                        }
                    }
                    else
                    {
                        escape = false;
                    }

                    builder->AppendChars(_u('\\'));
                    switch(c)
                    {
                        // Line terminators need to be escaped. \<lineTerminator> is a special case, where \\n doesn't work
                        // since that means a '\' followed by an 'n'. We need to use \n instead.
                        case _u('\n'):
                            builder->AppendChars(_u('n'));
                            break;
                        case _u('\r'):
                            builder->AppendChars(_u('r'));
                            break;
                        case _u('\x2028'):
                            builder->AppendChars(_u("u2028"));
                            break;
                        case _u('\x2029'):
                            builder->AppendChars(_u("u2029"));
                            break;

                        default:
                            builder->AppendChars(c);
                    }
                }
            }
        }

        if (!sourceOnly)
        {
            builder->AppendChars(_u('/'));

            // Cross-browser compatibility - flags are listed in alphabetical order in the spec and by other browsers
            // If you change the order of the flags, don't forget to change it in EntryGetterFlags() and GetOptions() too.
            if (pattern->IsGlobal())
            {
                builder->AppendChars(_u('g'));
            }
            if (pattern->IsIgnoreCase())
            {
                builder->AppendChars(_u('i'));
            }
            if (pattern->IsMultiline())
            {
                builder->AppendChars(_u('m'));
            }
            if (pattern->IsDotAll())
            {
                builder->AppendChars(_u('s'));
            }
            if (pattern->IsUnicode())
            {
                builder->AppendChars(_u('u'));
            }
            if (pattern->IsSticky())
            {
                builder->AppendChars(_u('y'));
            }
        }

        return builder;
    }